

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_DsdWritePrime(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  word *pwVar1;
  ulong uVar2;
  word wVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pStrInit;
  char cVar7;
  byte bVar8;
  byte bVar9;
  word *pwVar10;
  uint uVar11;
  ulong *puVar12;
  uint uVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  word pCofTemp [64];
  char pRes [2000];
  ulong local_a08 [64];
  char local_808;
  char local_807 [2007];
  
  if (nVars < 3) {
    __assert_fail("nVars > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                  ,0x414,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
  }
  cVar7 = (char)nVars;
  if (p->fSplitPrime == 0) {
    iVar5 = 2;
    if (p->fWriteTruth != 0) {
      pcVar15 = p->pOutput + p->nPos;
      iVar6 = 1 << (cVar7 - 6U & 0x1f);
      if (nVars < 7) {
        iVar6 = 1;
      }
      puVar12 = pTruth + (long)iVar6 + -1;
      pcVar14 = pcVar15;
      if (pTruth <= puVar12) {
        uVar16 = 0xf;
        if (nVars < 6) {
          uVar16 = (ulong)(uint)~(-1 << (cVar7 - 2U & 0x1f));
        }
        lVar17 = uVar16 << 2;
        lVar18 = uVar16 + 1;
        do {
          uVar11 = (uint)(*puVar12 >> ((byte)lVar17 & 0x3c)) & 0xf;
          cVar7 = '7';
          if (uVar11 < 10) {
            cVar7 = '0';
          }
          *pcVar14 = cVar7 + (char)uVar11;
          pcVar14 = pcVar14 + 1;
          lVar19 = lVar18 + -1;
          bVar4 = 0 < lVar18;
          lVar17 = lVar17 + -4;
          lVar18 = lVar19;
        } while ((lVar19 != 0 && bVar4) ||
                (puVar12 = puVar12 + -1, lVar17 = uVar16 << 2, lVar18 = uVar16 + 1,
                pTruth <= puVar12));
      }
      p->nPos = p->nPos + ((int)pcVar14 - (int)pcVar15);
    }
  }
  else {
    uVar11 = 1 << (cVar7 - 6U & 0x1f);
    if (nVars < 7) {
      uVar11 = 1;
    }
    iVar5 = Dau_DsdCheck1Step(p,pTruth,nVars,p->pVarLevels);
    if (iVar5 == -2) {
      pcVar14 = p->pOutput + p->nPos;
      puVar12 = pTruth + (long)(int)uVar11 + -1;
      pcVar15 = pcVar14;
      if (pTruth <= puVar12) {
        uVar16 = 0xf;
        if (nVars < 6) {
          uVar16 = (ulong)(uint)~(-1 << (cVar7 - 2U & 0x1f));
        }
        lVar17 = uVar16 << 2;
        lVar18 = uVar16 + 1;
        do {
          uVar11 = (uint)(*puVar12 >> ((byte)lVar17 & 0x3c)) & 0xf;
          cVar7 = '7';
          if (uVar11 < 10) {
            cVar7 = '0';
          }
          *pcVar15 = cVar7 + (char)uVar11;
          pcVar15 = pcVar15 + 1;
          lVar19 = lVar18 + -1;
          bVar4 = 0 < lVar18;
          lVar17 = lVar17 + -4;
          lVar18 = lVar19;
        } while ((lVar19 != 0 && bVar4) ||
                (puVar12 = puVar12 + -1, lVar17 = uVar16 << 2, lVar18 = uVar16 + 1,
                pTruth <= puVar12));
      }
      p->nPos = p->nPos + ((int)pcVar15 - (int)pcVar14);
      iVar5 = 2;
    }
    else {
      if (iVar5 == -1) {
        __assert_fail("vBest != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                      ,0x41a,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
      }
      iVar6 = p->nPos;
      p->nPos = iVar6 + 1;
      p->pOutput[iVar6] = '<';
      Dau_DsdWriteVar(p,iVar5,0);
      bVar9 = (byte)iVar5;
      if (uVar11 == 1) {
        local_a08[0] = (s_Truths6[iVar5] & *pTruth) >> ((byte)(1 << (bVar9 & 0x1f)) & 0x3f) |
                       s_Truths6[iVar5] & *pTruth;
      }
      else if (iVar5 < 6) {
        if (0 < (int)uVar11) {
          uVar16 = s_Truths6[iVar5];
          uVar20 = 0;
          do {
            local_a08[uVar20] =
                 (pTruth[uVar20] & uVar16) >> ((byte)(1 << (bVar9 & 0x1f)) & 0x3f) |
                 pTruth[uVar20] & uVar16;
            uVar20 = uVar20 + 1;
          } while (uVar11 != uVar20);
        }
      }
      else if (0 < (int)uVar11) {
        bVar8 = (byte)(iVar5 + -6);
        uVar13 = 1 << (bVar8 & 0x1f);
        iVar6 = 2 << (bVar8 & 0x1f);
        uVar16 = 1;
        if (1 < (int)uVar13) {
          uVar16 = (ulong)uVar13;
        }
        puVar12 = local_a08;
        pwVar10 = pTruth;
        do {
          if (iVar5 + -6 != 0x1f) {
            uVar20 = 0;
            do {
              uVar2 = pwVar10[(long)(int)uVar13 + uVar20];
              puVar12[uVar20] = uVar2;
              puVar12[(long)(int)uVar13 + uVar20] = uVar2;
              uVar20 = uVar20 + 1;
            } while (uVar16 != uVar20);
          }
          pwVar10 = pwVar10 + iVar6;
          puVar12 = puVar12 + iVar6;
        } while (pwVar10 < pTruth + (int)uVar11);
      }
      pwVar10 = local_a08;
      iVar6 = Dau_DsdDecompose(pwVar10,nVars,0,p->fWriteTruth,&local_808);
      if (iVar6 != 0) {
        __assert_fail("nNonDecSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                      ,0x427,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
      }
      if (local_808 != '\0') {
        pcVar15 = local_807;
        cVar7 = local_808;
        do {
          iVar6 = p->nPos;
          p->nPos = iVar6 + 1;
          p->pOutput[iVar6] = cVar7;
          cVar7 = *pcVar15;
          pcVar15 = pcVar15 + 1;
        } while (cVar7 != '\0');
      }
      if (uVar11 == 1) {
        local_a08[0] = (s_Truths6Neg[iVar5] & *pTruth) << ((byte)(1 << (bVar9 & 0x1f)) & 0x3f) |
                       s_Truths6Neg[iVar5] & *pTruth;
      }
      else if (iVar5 < 6) {
        if (0 < (int)uVar11) {
          uVar16 = s_Truths6Neg[iVar5];
          uVar20 = 0;
          do {
            local_a08[uVar20] =
                 (pTruth[uVar20] & uVar16) << ((byte)(1 << (bVar9 & 0x1f)) & 0x3f) |
                 pTruth[uVar20] & uVar16;
            uVar20 = uVar20 + 1;
          } while (uVar11 != uVar20);
        }
      }
      else if (0 < (int)uVar11) {
        pwVar1 = pTruth + (int)uVar11;
        bVar9 = (byte)(iVar5 + -6);
        uVar11 = 1 << (bVar9 & 0x1f);
        iVar6 = 2 << (bVar9 & 0x1f);
        uVar16 = 1;
        if (1 < (int)uVar11) {
          uVar16 = (ulong)uVar11;
        }
        puVar12 = local_a08 + (int)uVar11;
        do {
          if (iVar5 + -6 != 0x1f) {
            uVar20 = 0;
            do {
              wVar3 = pTruth[uVar20];
              pwVar10[uVar20] = wVar3;
              puVar12[uVar20] = wVar3;
              uVar20 = uVar20 + 1;
            } while (uVar16 != uVar20);
          }
          pTruth = pTruth + iVar6;
          puVar12 = puVar12 + iVar6;
          pwVar10 = pwVar10 + iVar6;
        } while (pTruth < pwVar1);
      }
      iVar5 = Dau_DsdDecompose(local_a08,nVars,0,p->fWriteTruth,&local_808);
      if (iVar5 != 0) {
        __assert_fail("nNonDecSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                      ,0x42c,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
      }
      if (local_808 != '\0') {
        pcVar15 = local_807;
        do {
          iVar5 = p->nPos;
          p->nPos = iVar5 + 1;
          p->pOutput[iVar5] = local_808;
          local_808 = *pcVar15;
          pcVar15 = pcVar15 + 1;
        } while (local_808 != '\0');
      }
      iVar5 = p->nPos;
      p->nPos = iVar5 + 1;
      p->pOutput[iVar5] = '>';
      iVar5 = 1;
    }
  }
  iVar6 = p->nPos;
  p->nPos = iVar6 + 1;
  p->pOutput[iVar6] = '{';
  uVar16 = 1;
  if (1 < nVars) {
    uVar16 = (ulong)(uint)nVars;
  }
  uVar20 = 0;
  do {
    Dau_DsdWriteVar(p,pVars[uVar20],0);
    uVar20 = uVar20 + 1;
  } while (uVar16 != uVar20);
  iVar6 = p->nPos;
  p->nPos = iVar6 + 1;
  p->pOutput[iVar6] = '}';
  p->nSizeNonDec = nVars;
  return iVar5;
}

Assistant:

static inline int Dau_DsdWritePrime( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars )
{
    int v, RetValue = 2;
    assert( nVars > 2 );
    if ( p->fSplitPrime )
    {
        word pCofTemp[DAU_MAX_WORD];
        int nWords = Abc_TtWordNum(nVars);
        int vBest = Dau_DsdCheck1Step( p, pTruth, nVars, p->pVarLevels );
        assert( vBest != -1 );
        if ( vBest == -2 ) // non-dec
            p->nPos += Abc_TtWriteHexRev( p->pOutput + p->nPos, pTruth, nVars );
        else 
        {
            char pRes[DAU_MAX_STR];
            int nNonDecSize;
            // compose the result
            Dau_DsdWriteString( p, "<" );
            Dau_DsdWriteVar( p, vBest, 0 );
            // split decomposition
            Abc_TtCofactor1p( pCofTemp, pTruth, nWords, vBest );
            nNonDecSize = Dau_DsdDecompose( pCofTemp, nVars, 0, p->fWriteTruth, pRes );
            assert( nNonDecSize == 0 );
            Dau_DsdWriteString( p, pRes );
            // split decomposition
            Abc_TtCofactor0p( pCofTemp, pTruth, nWords, vBest );
            nNonDecSize = Dau_DsdDecompose( pCofTemp, nVars, 0, p->fWriteTruth, pRes );
            assert( nNonDecSize == 0 );
            Dau_DsdWriteString( p, pRes );
            Dau_DsdWriteString( p, ">" );
            RetValue = 1;
        }
    }
    else if ( p->fWriteTruth )
        p->nPos += Abc_TtWriteHexRev( p->pOutput + p->nPos, pTruth, nVars );
    Dau_DsdWriteString( p, "{" );
    for ( v = 0; v < nVars; v++ )
        Dau_DsdWriteVar( p, pVars[v], 0 );
    Dau_DsdWriteString( p, "}" );
    p->nSizeNonDec = nVars;
    return RetValue;
}